

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlObject.h
# Opt level: O2

void __thiscall GdlObject::GdlObject(GdlObject *this)

{
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [40];
  
  (this->m_lnf).m_nLinePre = -1;
  (this->m_lnf).m_nLineOrig = -1;
  (this->m_lnf).m_staFile._M_dataplus._M_p = (pointer)&(this->m_lnf).m_staFile.field_2;
  (this->m_lnf).m_staFile._M_string_length = 0;
  (this->m_lnf).m_staFile.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string(local_60,"",&local_61);
  local_40._0_4_ = 0;
  local_40._4_4_ = 0;
  std::__cxx11::string::string((string *)(local_40 + 8),local_60);
  GrpLineAndFile::operator=(&this->m_lnf,(GrpLineAndFile *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

GdlObject()
	{
		m_lnf = GrpLineAndFile(0, 0, "");
	}